

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void charevnt_breakfast_vischar(tgestate_t *state,route_t *route)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = state->IY->character;
  if (bVar1 != 0) {
    route->step = '\0';
    bVar2 = bVar1 & 1 | 0x18;
    if (0x13 < bVar1) {
      bVar2 = bVar1 - 2;
    }
    route->index = bVar2;
    return;
  }
  set_hero_route(state,&charevnt_breakfast_vischar::t);
  return;
}

Assistant:

void charevnt_breakfast_vischar(tgestate_t *state, route_t *route)
{
  character_t character;
  vischar_t  *vischar;

  assert(state != NULL);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_0_COMMANDANT)
  {
    static const route_t t = { routeindex_43_7833, 0 }; /* was BC */
    set_hero_route(state, &t);
  }
  else
  {
    charevnt_breakfast_common(state, character, route); /* was fallthrough */
  }
}